

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_stream_amend.c
# Opt level: O3

MPP_RET h264e_vepu_stream_amend_config
                  (HalH264eVepuStreamAmend *ctx,MppPacket packet,MppEncCfgSet *cfg,H264eSlice *slice
                  ,H264ePrefixNal *prefix)

{
  MppEncRefCfg pvVar1;
  RK_U8 *pRVar2;
  size_t sVar3;
  
  pvVar1 = cfg->ref_cfg;
  if ((((*(int *)((long)pvVar1 + 0x1c) == 0) && (*(int *)((long)pvVar1 + 0x20) < 2)) &&
      ((cfg->codec).field_1.h264.hw_cfg.hw_poc_type == (cfg->codec).field_1.h264.poc_type)) &&
     ((cfg->codec).field_1.h264.hw_cfg.hw_log2_max_frame_num_minus4 ==
      (cfg->codec).field_1.h264.log2_max_frame_num)) {
    if (ctx->dst_buf != (RK_U8 *)0x0) {
      mpp_osal_free("h264e_vepu_stream_amend_config",ctx->dst_buf);
    }
    ctx->dst_buf = (RK_U8 *)0x0;
    if (ctx->src_buf != (RK_U8 *)0x0) {
      mpp_osal_free("h264e_vepu_stream_amend_config",ctx->src_buf);
    }
    *(undefined8 *)&ctx->buf_size = 0;
    ctx->packet = (MppPacket)0x0;
    ctx->buf_base = 0;
    ctx->old_length = 0;
    *(undefined8 *)&ctx->new_length = 0;
    ctx->src_buf = (RK_U8 *)0x0;
    ctx->dst_buf = (RK_U8 *)0x0;
    ctx->marking = (H264eMarkingInfo *)0x0;
    *(undefined8 *)&ctx->slice_enabled = 0;
    ctx->prefix = (H264ePrefixNal *)0x0;
    ctx->reorder = (H264eReorderInfo *)0x0;
    *(undefined8 *)ctx = 0;
    ctx->slice = (H264eSlice *)0x0;
    ctx->buf_size = 0x20000;
  }
  else {
    ctx->enable = 1;
    ctx->slice_enabled = 0;
    if (ctx->dst_buf == (RK_U8 *)0x0) {
      pRVar2 = (RK_U8 *)mpp_osal_calloc("h264e_vepu_stream_amend_config",(long)ctx->buf_size);
      ctx->dst_buf = pRVar2;
    }
    if (ctx->src_buf == (RK_U8 *)0x0) {
      pRVar2 = (RK_U8 *)mpp_osal_calloc("h264e_vepu_stream_amend_config",(long)ctx->buf_size);
      ctx->src_buf = pRVar2;
    }
  }
  slice->pic_order_cnt_type = (cfg->codec).field_1.h264.poc_type;
  ctx->slice = slice;
  if ((*(int *)((long)pvVar1 + 0x1c) != 0) || (1 < *(int *)((long)pvVar1 + 0x20))) {
    ctx->prefix = prefix;
  }
  ctx->packet = packet;
  sVar3 = mpp_packet_get_length(packet);
  ctx->buf_base = (RK_S32)sVar3;
  ctx->old_length = 0;
  ctx->new_length = 0;
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_stream_amend_config(HalH264eVepuStreamAmend *ctx,
                                       MppPacket packet, MppEncCfgSet *cfg,
                                       H264eSlice *slice, H264ePrefixNal *prefix)
{
    MppEncRefCfgImpl *ref = (MppEncRefCfgImpl *)cfg->ref_cfg;
    MppEncH264Cfg    *h264 = &cfg->codec.h264;
    MppEncH264HwCfg  *hw_cfg = &h264->hw_cfg;

    if (ref->lt_cfg_cnt || ref->st_cfg_cnt > 1 ||
        hw_cfg->hw_poc_type != h264->poc_type ||
        hw_cfg->hw_log2_max_frame_num_minus4 != h264->log2_max_frame_num) {
        ctx->enable = 1;
        ctx->slice_enabled = 0;

        if (NULL == ctx->dst_buf)
            ctx->dst_buf = mpp_calloc(RK_U8, ctx->buf_size);
        if (NULL == ctx->src_buf)
            ctx->src_buf = mpp_calloc(RK_U8, ctx->buf_size);
    } else {
        MPP_FREE(ctx->dst_buf);
        MPP_FREE(ctx->src_buf);
        h264e_vepu_stream_amend_init(ctx);
    }

    slice->pic_order_cnt_type = cfg->codec.h264.poc_type;

    ctx->slice = slice;
    if (ref->lt_cfg_cnt || ref->st_cfg_cnt > 1)
        ctx->prefix = prefix;

    ctx->packet = packet;
    ctx->buf_base = mpp_packet_get_length(packet);
    ctx->old_length = 0;
    ctx->new_length = 0;

    return MPP_OK;
}